

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::on_num
          (int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_> *this)

{
  num_writer f;
  char cVar1;
  int iVar2;
  string_view prefix;
  locale_ref in_stack_ffffffffffffffc8;
  undefined4 uStack_14;
  
  iVar2 = internal::count_digits(this->abs_value);
  cVar1 = internal::thousands_sep_impl<char>(in_stack_ffffffffffffffc8);
  iVar2 = iVar2 + (iVar2 + -1) / 3;
  uStack_14 = CONCAT31(uStack_14._1_3_,cVar1);
  f._12_4_ = uStack_14;
  f.size = iVar2;
  f.abs_value = this->abs_value;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
  ::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::num_writer>
            ((basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
              *)this->writer,iVar2,prefix,this->spec,f);
  return;
}

Assistant:

void on_num() {
      int num_digits = internal::count_digits(abs_value);
      char_type sep = internal::thousands_sep<char_type>(writer.locale_);
      int size = num_digits + SEP_SIZE * ((num_digits - 1) / 3);
      writer.write_int(size, get_prefix(), spec,
                       num_writer{abs_value, size, sep});
    }